

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O1

void __thiscall
antlr::RecognitionException::RecognitionException(RecognitionException *this,string *s)

{
  pointer pcVar1;
  
  (this->super_ANTLRException)._vptr_ANTLRException = (_func_int **)&PTR__ANTLRException_00305200;
  (this->super_ANTLRException).text._M_dataplus._M_p =
       (pointer)&(this->super_ANTLRException).text.field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_ANTLRException).text,pcVar1,pcVar1 + s->_M_string_length);
  (this->super_ANTLRException)._vptr_ANTLRException =
       (_func_int **)&PTR__RecognitionException_00306830;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  this->line = -1;
  this->column = -1;
  return;
}

Assistant:

RecognitionException::RecognitionException(const ANTLR_USE_NAMESPACE(std)string& s)
: ANTLRException(s)
, line(-1)
, column(-1)
{
}